

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  TidyTagId TVar1;
  uint uVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  Dict *pDVar5;
  Bool BVar6;
  NodeType NVar7;
  Node *node;
  uint code;
  Node **ppNVar8;
  Node *pNVar9;
  
  if ((list->tag->model & 1) != 0) {
    return;
  }
  pLVar3 = doc->lexer;
  pLVar3->insert = (IStack *)0x0;
  do {
LAB_0013e332:
    do {
      while( true ) {
        do {
          node = prvTidyGetToken(doc,IgnoreWhitespace);
          if (node == (Node *)0x0) {
            node = (Node *)0x0;
            code = 600;
            goto LAB_0013e532;
          }
          if ((node->tag == list->tag) && (node->type == EndTag)) {
            prvTidyFreeNode(doc,node);
            list->closed = yes;
            return;
          }
          BVar6 = InsertMisc(list,node);
        } while (BVar6 != no);
        BVar6 = prvTidynodeIsText(node);
        if (BVar6 != no) {
          prvTidyUngetToken(doc);
          node = prvTidyInferredTag(doc,TidyTag_DT);
          prvTidyReport(doc,list,node,0x25f);
        }
        pDVar4 = node->tag;
        if (pDVar4 != (Dict *)0x0) break;
LAB_0013e45e:
        prvTidyReport(doc,list,node,0x233);
        prvTidyFreeNode(doc,node);
      }
      NVar7 = node->type;
      if (NVar7 == EndTag) {
        pNVar9 = list;
        if (pDVar4->id != TidyTag_FORM) {
          while (pNVar9 = pNVar9->parent, pNVar9 != (Node *)0x0) {
            pDVar5 = pNVar9->tag;
            if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_BODY)) goto LAB_0013e45e;
            if (pDVar4 == pDVar5) {
              prvTidyReport(doc,list,node,599);
              prvTidyUngetToken(doc);
              return;
            }
          }
          if (node != (Node *)0x0) goto LAB_0013e3f5;
LAB_0013e40a:
          prvTidyUngetToken(doc);
          uVar2 = node->tag->model;
          if ((uVar2 & 0x18) == 0) {
            code = 0x27c;
LAB_0013e532:
            prvTidyReport(doc,list,node,code);
            return;
          }
          if (((uVar2 & 0x10) == 0) && (pLVar3->excludeBlocks != no)) {
            return;
          }
          node = prvTidyInferredTag(doc,TidyTag_DD);
          prvTidyReport(doc,list,node,0x25f);
          NVar7 = node->type;
          goto LAB_0013e459;
        }
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
        goto LAB_0013e45e;
      }
LAB_0013e3f5:
      TVar1 = pDVar4->id;
      if ((TVar1 == TidyTag_DD) || (TVar1 == TidyTag_DT)) {
LAB_0013e459:
        if (NVar7 == EndTag) goto LAB_0013e45e;
        node->parent = list;
        pNVar9 = list->last;
        node->prev = pNVar9;
        ppNVar8 = &pNVar9->next;
        if (pNVar9 == (Node *)0x0) {
          ppNVar8 = &list->content;
        }
        *ppNVar8 = node;
        list->last = node;
        ParseTag(doc,node,IgnoreWhitespace);
        goto LAB_0013e332;
      }
      if (TVar1 != TidyTag_CENTER) goto LAB_0013e40a;
      if (list->content == (Node *)0x0) {
        prvTidyInsertNodeBeforeElement(list,node);
      }
      else {
        prvTidyInsertNodeAfterElement(list,node);
      }
      pNVar9 = node->parent;
      pLVar3->excludeBlocks = no;
      ParseTag(doc,node,mode);
      pLVar3->excludeBlocks = yes;
    } while (pNVar9->last != node);
    list = prvTidyInferredTag(doc,TidyTag_DL);
    prvTidyInsertNodeAfterElement(node,list);
  } while( true );
}

Assistant:

void TY_(ParseDefList)(TidyDocImpl* doc, Node *list, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;

    if (list->tag->model & CM_EMPTY)
        return;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_DT);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            Bool discardIt = no;
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            for (parent = list->parent;
                    parent != NULL; parent = parent->parent)
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1098012. */
                if (nodeIsBODY(parent))
                {
                    discardIt = yes;
                    break;
                }
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);

                    TY_(UngetToken)( doc );
                    return;
                }
            }
            if (discardIt)
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
        }

        /* center in a dt or a dl breaks the dl list in two */
        if ( nodeIsCENTER(node) )
        {
            if (list->content)
                TY_(InsertNodeAfterElement)(list, node);
            else /* trim empty dl list */
            {
                TY_(InsertNodeBeforeElement)(list, node);
            }

            /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                         Gary Dechaines 11 Aug 00 */
            /* ParseTag can destroy node, if it finds that
             * this <center> is followed immediately by </center>.
             * It's awkward but necessary to determine if this
             * has happened.
             */
            parent = node->parent;

            /* and parse contents of center */
            lexer->excludeBlocks = no;
            ParseTag( doc, node, mode);
            lexer->excludeBlocks = yes;

            /* now create a new dl element,
             * unless node has been blown away because the
             * center was empty, as above.
             */
            if (parent->last == node)
            {
                list = TY_(InferredTag)(doc, TidyTag_DL);
                TY_(InsertNodeAfterElement)(node, list);
            }
            continue;
        }

        if ( !(nodeIsDT(node) || nodeIsDD(node)) )
        {
            TY_(UngetToken)( doc );

            if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
            {
                TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                return;
            }

            /* if DD appeared directly in BODY then exclude blocks */
            if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                return;

            node = TY_(InferredTag)(doc, TidyTag_DD);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <DT> or <DD>*/
        TY_(InsertNodeAtEnd)(list, node);
        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
}